

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

vm_obj_id_t CVmObjStringBuffer::create(int in_root_set,int32_t alo,int32_t inc)

{
  vm_obj_id_t obj_id;
  int iVar1;
  undefined8 *puVar2;
  undefined4 extraout_var;
  undefined4 *puVar3;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,0,0);
  puVar2 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar2 = &PTR_get_metaclass_reg_0032d9f8;
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,(long)(alo * 4 + 0xc),puVar2);
  puVar3 = (undefined4 *)CONCAT44(extraout_var,iVar1);
  puVar3[1] = alo;
  puVar3[2] = inc;
  *puVar3 = 0;
  puVar2[1] = puVar3;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjStringBuffer::create(VMG_ int in_root_set,
                                       int32_t alo, int32_t inc)
{
    /* allocate the object ID */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);

    /* create the C++ object */
    new (vmg_ id) CVmObjStringBuffer(vmg_ alo, inc);

    /* return the new ID */
    return id;
}